

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
::get_cbor_binary(binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
                  *this,binary_t *result)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  bool bVar1;
  byte bVar2;
  char_int_type cVar3;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_RSI;
  const_iterator in_RDI;
  string last_token;
  binary_t chunk;
  uint64_t len_3;
  uint32_t len_2;
  uint16_t len_1;
  uint8_t len;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_fffffffffffffe80;
  binary_t *in_stack_fffffffffffffe88;
  long *plVar4;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_fffffffffffffe90;
  input_format_t format;
  undefined8 uVar5;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_fffffffffffffe98;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  undefined4 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebc;
  undefined1 in_stack_fffffffffffffebd;
  undefined1 in_stack_fffffffffffffebe;
  undefined1 in_stack_fffffffffffffebf;
  allocator<char> local_129;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [8];
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  input_format_t in_stack_ffffffffffffff34;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_ffffffffffffff38;
  string local_a0 [32];
  uchar *local_80;
  char *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffb8;
  pointer in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  byte local_1;
  
  bVar1 = unexpect_eof(in_stack_ffffffffffffff98,
                       (input_format_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                       in_stack_ffffffffffffff88);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __first._M_current = (uchar *)(ulong)(*(int *)(in_RDI._M_current + 0x10) - 0x40);
    format = (input_format_t)((ulong)in_stack_fffffffffffffe90 >> 0x20);
    switch(__first._M_current) {
    case (uchar *)0x0:
    case (uchar *)0x1:
    case (uchar *)0x2:
    case (uchar *)0x3:
    case (uchar *)0x4:
    case (uchar *)0x5:
    case (uchar *)0x6:
    case (uchar *)0x7:
    case (uchar *)0x8:
    case (uchar *)0x9:
    case (uchar *)0xa:
    case (uchar *)0xb:
    case (uchar *)0xc:
    case (uchar *)0xd:
    case (uchar *)0xe:
    case (uchar *)0xf:
    case (uchar *)0x10:
    case (uchar *)0x11:
    case (uchar *)0x12:
    case (uchar *)0x13:
    case (uchar *)0x14:
    case (uchar *)0x15:
    case (uchar *)0x16:
    case (uchar *)0x17:
      local_1 = get_binary<unsigned_int>
                          (in_stack_fffffffffffffe90,
                           (input_format_t)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                           (uint)in_stack_fffffffffffffe88,(binary_t *)in_stack_fffffffffffffe80);
      break;
    case (uchar *)0x18:
      bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
              ::get_number<unsigned_char,false>
                        (in_stack_fffffffffffffe98,format,(uchar *)in_stack_fffffffffffffe88);
      local_1 = 0;
      if (bVar1) {
        local_1 = get_binary<unsigned_char>
                            (in_stack_fffffffffffffe80,
                             (input_format_t)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                             (uchar)((ulong)in_stack_fffffffffffffe78 >> 0x18),
                             (binary_t *)in_stack_fffffffffffffe70);
      }
      break;
    case (uchar *)0x19:
      bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
              ::get_number<unsigned_short,false>
                        (in_stack_fffffffffffffe98,format,
                         (unsigned_short *)in_stack_fffffffffffffe88);
      local_1 = 0;
      if (bVar1) {
        local_1 = get_binary<unsigned_short>
                            (in_stack_fffffffffffffe80,
                             (input_format_t)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                             (unsigned_short)((ulong)in_stack_fffffffffffffe78 >> 0x10),
                             (binary_t *)in_stack_fffffffffffffe70);
      }
      break;
    case (uchar *)0x1a:
      bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
              ::get_number<unsigned_int,false>
                        (in_stack_fffffffffffffe98,format,(uint *)in_stack_fffffffffffffe88);
      local_1 = 0;
      if (bVar1) {
        local_1 = get_binary<unsigned_int>
                            (in_stack_fffffffffffffe90,
                             (input_format_t)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                             (uint)in_stack_fffffffffffffe88,(binary_t *)in_stack_fffffffffffffe80);
      }
      break;
    case (uchar *)0x1b:
      bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
              ::get_number<unsigned_long,false>
                        (in_stack_fffffffffffffe98,format,(unsigned_long *)in_stack_fffffffffffffe88
                        );
      local_1 = 0;
      if (bVar1) {
        local_1 = get_binary<unsigned_long>
                            (in_stack_fffffffffffffea0,
                             (input_format_t)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                             (unsigned_long)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      }
      break;
    default:
      get_token_string((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
                        *)CONCAT17(in_stack_fffffffffffffebf,
                                   CONCAT16(in_stack_fffffffffffffebe,
                                            CONCAT15(in_stack_fffffffffffffebd,
                                                     CONCAT14(in_stack_fffffffffffffebc,
                                                              in_stack_fffffffffffffeb8)))));
      uVar5 = *(undefined8 *)(in_RDI._M_current + 0x18);
      plVar4 = *(long **)(in_RDI._M_current + 0x28);
      std::operator+((char *)CONCAT17(in_stack_fffffffffffffebf,
                                      CONCAT16(in_stack_fffffffffffffebe,
                                               CONCAT15(in_stack_fffffffffffffebd,
                                                        CONCAT14(in_stack_fffffffffffffebc,
                                                                 in_stack_fffffffffffffeb8)))),
                     in_stack_fffffffffffffeb0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (allocator<char> *)in_stack_fffffffffffffea0);
      exception_message(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                        in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      parse_error::create(in_stack_ffffffffffffffcc,(size_t)in_stack_ffffffffffffffc0,
                          in_stack_ffffffffffffffb8);
      bVar2 = (**(code **)(*plVar4 + 0x60))(plVar4,uVar5,local_a0,&stack0xffffffffffffff38);
      local_1 = bVar2 & 1;
      parse_error::~parse_error((parse_error *)0x116a54);
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator(&local_129);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_a0);
      break;
    case (uchar *)0x1f:
      do {
        cVar3 = get(in_stack_fffffffffffffe70);
        if (cVar3 == 0xff) {
          local_1 = 1;
          break;
        }
        this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffb8;
        byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
        byte_container_with_subtype
                  ((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffffe70);
        bVar1 = get_cbor_binary(in_RSI,(binary_t *)
                                       CONCAT17(in_stack_ffffffffffffffe7,
                                                CONCAT16(in_stack_ffffffffffffffe6,
                                                         CONCAT24(in_stack_ffffffffffffffe4,
                                                                  in_stack_ffffffffffffffe0))));
        in_stack_fffffffffffffeb8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeb8);
        if (bVar1) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
          __gnu_cxx::
          __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::__normal_iterator<unsigned_char*>
                    ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_stack_fffffffffffffe70,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
          __last._M_current._4_1_ = in_stack_fffffffffffffebc;
          __last._M_current._0_4_ = in_stack_fffffffffffffeb8;
          __last._M_current._5_1_ = in_stack_fffffffffffffebd;
          __last._M_current._6_1_ = in_stack_fffffffffffffebe;
          __last._M_current._7_1_ = in_stack_fffffffffffffebf;
          local_80 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                              insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                        (this_00,in_RDI,__first,__last);
        }
        else {
          local_1 = 0;
        }
        byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
        ~byte_container_with_subtype
                  ((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)0x116931);
      } while (bVar1);
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool get_cbor_binary(binary_t& result)
    {
        if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(input_format_t::cbor, "binary")))
        {
            return false;
        }

        switch (current)
        {
            // Binary data (0x00..0x17 bytes follow)
            case 0x40:
            case 0x41:
            case 0x42:
            case 0x43:
            case 0x44:
            case 0x45:
            case 0x46:
            case 0x47:
            case 0x48:
            case 0x49:
            case 0x4A:
            case 0x4B:
            case 0x4C:
            case 0x4D:
            case 0x4E:
            case 0x4F:
            case 0x50:
            case 0x51:
            case 0x52:
            case 0x53:
            case 0x54:
            case 0x55:
            case 0x56:
            case 0x57:
            {
                return get_binary(input_format_t::cbor, static_cast<unsigned int>(current) & 0x1Fu, result);
            }

            case 0x58: // Binary data (one-byte uint8_t for n follows)
            {
                std::uint8_t len{};
                return get_number(input_format_t::cbor, len) &&
                       get_binary(input_format_t::cbor, len, result);
            }

            case 0x59: // Binary data (two-byte uint16_t for n follow)
            {
                std::uint16_t len{};
                return get_number(input_format_t::cbor, len) &&
                       get_binary(input_format_t::cbor, len, result);
            }

            case 0x5A: // Binary data (four-byte uint32_t for n follow)
            {
                std::uint32_t len{};
                return get_number(input_format_t::cbor, len) &&
                       get_binary(input_format_t::cbor, len, result);
            }

            case 0x5B: // Binary data (eight-byte uint64_t for n follow)
            {
                std::uint64_t len{};
                return get_number(input_format_t::cbor, len) &&
                       get_binary(input_format_t::cbor, len, result);
            }

            case 0x5F: // Binary data (indefinite length)
            {
                while (get() != 0xFF)
                {
                    binary_t chunk;
                    if (!get_cbor_binary(chunk))
                    {
                        return false;
                    }
                    result.insert(result.end(), chunk.begin(), chunk.end());
                }
                return true;
            }

            default:
            {
                auto last_token = get_token_string();
                return sax->parse_error(chars_read, last_token, parse_error::create(113, chars_read, exception_message(input_format_t::cbor, "expected length specification (0x40-0x5B) or indefinite binary array type (0x5F); last byte: 0x" + last_token, "binary")));
            }
        }
    }